

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriConnectivity.cc
# Opt level: O2

HalfedgeHandle __thiscall
OpenMesh::TriConnectivity::vertex_split
          (TriConnectivity *this,VertexHandle v0,VertexHandle v1,VertexHandle vl,VertexHandle vr)

{
  HalfedgeHandle HVar1;
  BaseHandle _h0;
  BaseHandle _hh;
  
  _hh.idx_ = -1;
  _h0.idx_ = _hh.idx_;
  if (vl.super_BaseHandle.idx_ != -1) {
    HVar1 = PolyConnectivity::find_halfedge(&this->super_PolyConnectivity,v1,vl);
    if (HVar1.super_BaseHandle.idx_ == -1) {
      __assert_fail("v1vl.is_valid()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/TriConnectivity.cc"
                    ,0xbb,
                    "TriConnectivity::HalfedgeHandle OpenMesh::TriConnectivity::vertex_split(VertexHandle, VertexHandle, VertexHandle, VertexHandle)"
                   );
    }
    _h0.idx_ = (int)insert_loop(this,HVar1);
  }
  if (vr.super_BaseHandle.idx_ != -1) {
    _hh.idx_ = (int)PolyConnectivity::find_halfedge(&this->super_PolyConnectivity,vr,v1);
    if (_hh.idx_ == -1) {
      __assert_fail("vrv1.is_valid()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/TriConnectivity.cc"
                    ,0xc3,
                    "TriConnectivity::HalfedgeHandle OpenMesh::TriConnectivity::vertex_split(VertexHandle, VertexHandle, VertexHandle, VertexHandle)"
                   );
    }
    insert_loop(this,(HalfedgeHandle)_hh.idx_);
  }
  if (vl.super_BaseHandle.idx_ == -1) {
    HVar1 = ArrayKernel::halfedge_handle((ArrayKernel *)this,v1);
    _h0.idx_ = (int)ArrayKernel::prev_halfedge_handle
                              ((ArrayKernel *)this,HVar1.super_BaseHandle.idx_);
  }
  if (vr.super_BaseHandle.idx_ == -1) {
    HVar1 = ArrayKernel::halfedge_handle((ArrayKernel *)this,v1);
    _hh.idx_ = (int)ArrayKernel::prev_halfedge_handle
                              ((ArrayKernel *)this,HVar1.super_BaseHandle.idx_);
  }
  HVar1 = insert_edge(this,v0,(HalfedgeHandle)_h0.idx_,(HalfedgeHandle)_hh.idx_);
  return (HalfedgeHandle)HVar1.super_BaseHandle.idx_;
}

Assistant:

TriConnectivity::HalfedgeHandle
TriConnectivity::vertex_split(VertexHandle v0, VertexHandle v1,
                              VertexHandle vl, VertexHandle vr)
{
  HalfedgeHandle v1vl, vlv1, vrv1, v0v1;

  // build loop from halfedge v1->vl
  if (vl.is_valid())
  {
    v1vl = find_halfedge(v1, vl);
    assert(v1vl.is_valid());
    vlv1 = insert_loop(v1vl);
  }

  // build loop from halfedge vr->v1
  if (vr.is_valid())
  {
    vrv1 = find_halfedge(vr, v1);
    assert(vrv1.is_valid());
    insert_loop(vrv1);
  }

  // handle boundary cases
  if (!vl.is_valid())
    vlv1 = prev_halfedge_handle(halfedge_handle(v1));
  if (!vr.is_valid())
    vrv1 = prev_halfedge_handle(halfedge_handle(v1));


  // split vertex v1 into edge v0v1
  v0v1 = insert_edge(v0, vlv1, vrv1);


  return v0v1;
}